

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution2d.cpp
# Opt level: O0

float __thiscall embree::Distribution2D::pdf(Distribution2D *this,Vec2f *p)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  float fVar2;
  float fVar3;
  int idx;
  int local_68;
  int local_64;
  undefined4 uVar4;
  int local_40;
  int local_3c;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  fVar3 = (float)*(ulong *)(in_RDI + 8);
  local_40 = (int)(*(float *)(in_RSI + 4) * fVar3);
  uVar4 = 0;
  iVar1 = (int)*(undefined8 *)(in_RDI + 8) + -1;
  local_18 = &local_40;
  local_20 = &stack0xffffffffffffffbc;
  local_28 = &stack0xffffffffffffffb8;
  local_64 = iVar1;
  if (local_40 < iVar1) {
    local_64 = local_40;
  }
  local_10 = 0;
  local_c = local_64;
  local_68 = local_10;
  if (-1 < local_64) {
    local_68 = local_64;
  }
  local_3c = local_68;
  local_8 = iVar1;
  local_4 = local_40;
  std::vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>::operator[]
            ((vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_> *)
             (in_RDI + 0x48),(long)local_68);
  fVar2 = Distribution1D::pdf((Distribution1D *)CONCAT44(uVar4,iVar1),fVar3);
  fVar3 = Distribution1D::pdf((Distribution1D *)CONCAT44(uVar4,iVar1),fVar3);
  return fVar2 * fVar3;
}

Assistant:

float Distribution2D::pdf(const Vec2f& p) const {
    int idx = clamp(int(p.y*height),0,int(height)-1);
    return xDists[idx].pdf(p.x) * yDist.pdf(p.y);
  }